

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall testing::internal::MatchMatrix::Randomize(MatchMatrix *this)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = this->num_elements_;
  if (uVar3 != 0) {
    uVar5 = this->num_matchers_;
    uVar4 = 0;
    do {
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar3 = 0;
        do {
          pcVar1 = (this->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar2 = rand();
          pcVar1[uVar3 + uVar5 * uVar4] = (byte)iVar2 & 1;
          uVar3 = uVar3 + 1;
          uVar5 = this->num_matchers_;
        } while (uVar3 < uVar5);
        uVar3 = this->num_elements_;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

size_t RhsSize() const { return num_matchers_; }